

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlwriter.c
# Opt level: O0

int xmlTextWriterStartDTD(xmlTextWriterPtr writer,xmlChar *name,xmlChar *pubid,xmlChar *sysid)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  xmlLinkPtr lk_00;
  void *pvVar5;
  long *data;
  xmlChar *pxVar6;
  xmlTextWriterStackEntry *p;
  xmlLinkPtr lk;
  int sum;
  int count;
  xmlChar *sysid_local;
  xmlChar *pubid_local;
  xmlChar *name_local;
  xmlTextWriterPtr writer_local;
  
  if (((writer == (xmlTextWriterPtr)0x0) || (name == (xmlChar *)0x0)) || (*name == '\0')) {
    writer_local._4_4_ = -1;
  }
  else {
    lk_00 = xmlListFront(writer->nodes);
    if ((lk_00 != (xmlLinkPtr)0x0) && (pvVar5 = xmlLinkGetData(lk_00), pvVar5 != (void *)0x0)) {
      xmlWriterErrMsg(writer,XML_ERR_INTERNAL_ERROR,
                      "xmlTextWriterStartDTD : DTD allowed only in prolog!\n");
      return -1;
    }
    data = (long *)(*xmlMalloc)(0x10);
    if (data == (long *)0x0) {
      xmlWriterErrMsg(writer,XML_ERR_NO_MEMORY,"xmlTextWriterStartDTD : out of memory!\n");
      writer_local._4_4_ = -1;
    }
    else {
      pxVar6 = xmlStrdup(name);
      *data = (long)pxVar6;
      if (*data == 0) {
        xmlWriterErrMsg(writer,XML_ERR_NO_MEMORY,"xmlTextWriterStartDTD : out of memory!\n");
        (*xmlFree)(data);
        writer_local._4_4_ = -1;
      }
      else {
        *(undefined4 *)(data + 1) = 7;
        xmlListPushFront(writer->nodes,data);
        iVar1 = xmlOutputBufferWriteString(writer->out,"<!DOCTYPE ");
        if (iVar1 < 0) {
          writer_local._4_4_ = -1;
        }
        else {
          iVar2 = xmlOutputBufferWriteString(writer->out,(char *)name);
          if (iVar2 < 0) {
            writer_local._4_4_ = -1;
          }
          else {
            lk._0_4_ = iVar2 + iVar1;
            if (pubid != (xmlChar *)0x0) {
              if (sysid == (xmlChar *)0x0) {
                xmlWriterErrMsg(writer,XML_ERR_INTERNAL_ERROR,
                                "xmlTextWriterStartDTD : system identifier needed!\n");
                return -1;
              }
              if (writer->indent == 0) {
                lk._4_4_ = xmlOutputBufferWrite(writer->out,1," ");
              }
              else {
                lk._4_4_ = xmlOutputBufferWrite(writer->out,1,"\n");
              }
              if (lk._4_4_ < 0) {
                return -1;
              }
              iVar1 = xmlOutputBufferWriteString(writer->out,"PUBLIC ");
              if (iVar1 < 0) {
                return -1;
              }
              iVar2 = xmlOutputBufferWrite(writer->out,1,&writer->qchar);
              if (iVar2 < 0) {
                return -1;
              }
              iVar3 = xmlOutputBufferWriteString(writer->out,(char *)pubid);
              if (iVar3 < 0) {
                return -1;
              }
              iVar4 = xmlOutputBufferWrite(writer->out,1,&writer->qchar);
              if (iVar4 < 0) {
                return -1;
              }
              lk._0_4_ = iVar4 + iVar3 + iVar2 + iVar1 + lk._4_4_ + (int)lk;
            }
            if (sysid != (xmlChar *)0x0) {
              if (pubid == (xmlChar *)0x0) {
                if (writer->indent == 0) {
                  lk._4_4_ = xmlOutputBufferWrite(writer->out,1," ");
                }
                else {
                  lk._4_4_ = xmlOutputBufferWrite(writer->out,1,"\n");
                }
                if (lk._4_4_ < 0) {
                  return -1;
                }
                iVar1 = xmlOutputBufferWriteString(writer->out,"SYSTEM ");
                if (iVar1 < 0) {
                  return -1;
                }
                lk._0_4_ = iVar1 + lk._4_4_ + (int)lk;
              }
              else {
                if (writer->indent == 0) {
                  lk._4_4_ = xmlOutputBufferWrite(writer->out,1," ");
                }
                else {
                  lk._4_4_ = xmlOutputBufferWriteString(writer->out,"\n       ");
                }
                if (lk._4_4_ < 0) {
                  return -1;
                }
                lk._0_4_ = lk._4_4_ + (int)lk;
              }
              iVar1 = xmlOutputBufferWrite(writer->out,1,&writer->qchar);
              if (iVar1 < 0) {
                return -1;
              }
              iVar2 = xmlOutputBufferWriteString(writer->out,(char *)sysid);
              if (iVar2 < 0) {
                return -1;
              }
              iVar3 = xmlOutputBufferWrite(writer->out,1,&writer->qchar);
              if (iVar3 < 0) {
                return -1;
              }
              lk._0_4_ = iVar3 + iVar2 + iVar1 + (int)lk;
            }
            writer_local._4_4_ = (int)lk;
          }
        }
      }
    }
  }
  return writer_local._4_4_;
}

Assistant:

int
xmlTextWriterStartDTD(xmlTextWriterPtr writer,
                      const xmlChar * name,
                      const xmlChar * pubid, const xmlChar * sysid)
{
    int count;
    int sum;
    xmlLinkPtr lk;
    xmlTextWriterStackEntry *p;

    if (writer == NULL || name == NULL || *name == '\0')
        return -1;

    sum = 0;
    lk = xmlListFront(writer->nodes);
    if ((lk != NULL) && (xmlLinkGetData(lk) != NULL)) {
        xmlWriterErrMsg(writer, XML_ERR_INTERNAL_ERROR,
                        "xmlTextWriterStartDTD : DTD allowed only in prolog!\n");
        return -1;
    }

    p = (xmlTextWriterStackEntry *)
        xmlMalloc(sizeof(xmlTextWriterStackEntry));
    if (p == 0) {
        xmlWriterErrMsg(writer, XML_ERR_NO_MEMORY,
                        "xmlTextWriterStartDTD : out of memory!\n");
        return -1;
    }

    p->name = xmlStrdup(name);
    if (p->name == 0) {
        xmlWriterErrMsg(writer, XML_ERR_NO_MEMORY,
                        "xmlTextWriterStartDTD : out of memory!\n");
        xmlFree(p);
        return -1;
    }
    p->state = XML_TEXTWRITER_DTD;

    xmlListPushFront(writer->nodes, p);

    count = xmlOutputBufferWriteString(writer->out, "<!DOCTYPE ");
    if (count < 0)
        return -1;
    sum += count;
    count = xmlOutputBufferWriteString(writer->out, (const char *) name);
    if (count < 0)
        return -1;
    sum += count;

    if (pubid != 0) {
        if (sysid == 0) {
            xmlWriterErrMsg(writer, XML_ERR_INTERNAL_ERROR,
                            "xmlTextWriterStartDTD : system identifier needed!\n");
            return -1;
        }

        if (writer->indent)
            count = xmlOutputBufferWrite(writer->out, 1, "\n");
        else
            count = xmlOutputBufferWrite(writer->out, 1, " ");
        if (count < 0)
            return -1;
        sum += count;

        count = xmlOutputBufferWriteString(writer->out, "PUBLIC ");
        if (count < 0)
            return -1;
        sum += count;

        count = xmlOutputBufferWrite(writer->out, 1, &writer->qchar);
        if (count < 0)
            return -1;
        sum += count;

        count =
            xmlOutputBufferWriteString(writer->out, (const char *) pubid);
        if (count < 0)
            return -1;
        sum += count;

        count = xmlOutputBufferWrite(writer->out, 1, &writer->qchar);
        if (count < 0)
            return -1;
        sum += count;
    }

    if (sysid != 0) {
        if (pubid == 0) {
            if (writer->indent)
                count = xmlOutputBufferWrite(writer->out, 1, "\n");
            else
                count = xmlOutputBufferWrite(writer->out, 1, " ");
            if (count < 0)
                return -1;
            sum += count;
            count = xmlOutputBufferWriteString(writer->out, "SYSTEM ");
            if (count < 0)
                return -1;
            sum += count;
        } else {
			if (writer->indent)
            count = xmlOutputBufferWriteString(writer->out, "\n       ");
            else
                count = xmlOutputBufferWrite(writer->out, 1, " ");
            if (count < 0)
                return -1;
            sum += count;
        }

        count = xmlOutputBufferWrite(writer->out, 1, &writer->qchar);
        if (count < 0)
            return -1;
        sum += count;

        count =
            xmlOutputBufferWriteString(writer->out, (const char *) sysid);
        if (count < 0)
            return -1;
        sum += count;

        count = xmlOutputBufferWrite(writer->out, 1, &writer->qchar);
        if (count < 0)
            return -1;
        sum += count;
    }

    return sum;
}